

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O1

future<void> DelayedSetChannel(int channel,int value,double delay)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Result_base *p_Var3;
  undefined4 in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_0000003c;
  _State_baseV2 *__tmp;
  bool bVar5;
  future<void> fVar6;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  __state_type local_68;
  long *local_50;
  double local_48;
  _func_int **local_40 [2];
  
  local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = delay;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011da50;
  peVar1 = (element_type *)(p_Var2 + 1);
  p_Var2[2]._M_use_count = 0;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var2[1]._M_weak_count + 1) = 0;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[3]._M_use_count = 0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0011daa0;
  p_Var3 = (_Result_base *)operator_new(0x10);
  *(undefined8 *)p_Var3 = 0;
  *(undefined8 *)(p_Var3 + 8) = 0;
  std::__future_base::_Result_base::_Result_base(p_Var3);
  *(undefined ***)p_Var3 = &PTR__M_destroy_0011dcb8;
  p_Var2[4]._vptr__Sp_counted_base = (_func_int **)p_Var3;
  *(double *)&p_Var2[4]._M_use_count = local_48;
  *(int *)&p_Var2[5]._vptr__Sp_counted_base = value;
  *(undefined4 *)((long)&p_Var2[5]._vptr__Sp_counted_base + 4) = in_EDX;
  local_40[0] = (_func_int **)0x0;
  local_50 = (long *)operator_new(0x20);
  *local_50 = (long)&PTR___State_0011daf8;
  local_50[1] = (long)peVar1;
  local_50[2] = (long)std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pjueon[P]JetsonGPIO/tests/test_all_apis.cpp:66:16)>_>,_void>
                      ::_M_run;
  local_50[3] = 0;
  std::thread::_M_start_thread(local_40,&local_50,0);
  if (local_50 != (long *)0x0) {
    (**(code **)(*local_50 + 8))();
  }
  _Var4._M_pi = local_68.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (p_Var2[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var2[3]._vptr__Sp_counted_base = local_40[0];
    bVar5 = local_68.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (bVar5) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    if (local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
      p_Var2->_M_use_count = 1;
      p_Var2->_M_weak_count = 1;
      p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011db38;
      p_Var2[2]._M_use_count = 0;
      p_Var2[1]._M_use_count = 0;
      p_Var2[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var2[1]._M_weak_count + 1) = 0;
      p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_0011db88;
      p_Var3 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)p_Var3 = 0;
      *(undefined8 *)(p_Var3 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(p_Var3);
      _Var4._M_pi = local_68.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      *(undefined ***)p_Var3 = &PTR__M_destroy_0011dcb8;
      p_Var2[3]._vptr__Sp_counted_base = (_func_int **)p_Var3;
      *(double *)&p_Var2[3]._M_use_count = local_48;
      *(int *)&p_Var2[4]._vptr__Sp_counted_base = value;
      *(undefined4 *)((long)&p_Var2[4]._vptr__Sp_counted_base + 4) = in_EDX;
      bVar5 = local_68.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var2 + 1);
      local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if (bVar5) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
      }
    }
    std::__basic_future<void>::__basic_future
              ((__basic_future<void> *)CONCAT44(in_register_0000003c,channel),&local_68);
    _Var4._M_pi = extraout_RDX;
    if (local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var4._M_pi = extraout_RDX_00;
    }
    fVar6.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var4._M_pi;
    fVar6.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CONCAT44(in_register_0000003c,channel);
    return (future<void>)
           fVar6.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::terminate();
}

Assistant:

std::future<void> DelayedSetChannel(int channel, int value, double delay)
{
    auto run = [=]()
    {
        sleep(delay);
        GPIO::output(channel, value);
    };

    return std::async(std::launch::async, run);
}